

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_recover
              (secp256k1_context *ctx,uchar *deckey32,secp256k1_ecdsa_signature *sig,
              uchar *adaptor_sig162,secp256k1_pubkey *enckey)

{
  int iVar1;
  uint uVar2;
  size_t sStack_210;
  int ret;
  size_t size;
  uchar enckey_expected33 [33];
  uchar local_1d8;
  undefined1 auStack_1d7 [7];
  uchar enckey33 [33];
  secp256k1_gej enckey_expected_gej;
  secp256k1_ge enckey_expected_ge;
  secp256k1_scalar deckey;
  secp256k1_scalar r;
  secp256k1_scalar s;
  secp256k1_scalar adaptor_sigr;
  secp256k1_scalar sp;
  secp256k1_pubkey *enckey_local;
  uchar *adaptor_sig162_local;
  secp256k1_ecdsa_signature *sig_local;
  uchar *deckey32_local;
  secp256k1_context *ctx_local;
  
  sStack_210 = 0x21;
  iVar1 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call
              (&ctx->illegal_callback,"secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)")
    ;
    ctx_local._4_4_ = 0;
  }
  else if (deckey32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"deckey32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (adaptor_sig162 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"adaptor_sig162 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (enckey == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"enckey != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                      ((secp256k1_ge *)0x0,(secp256k1_scalar *)(s.d + 3),(secp256k1_ge *)0x0,
                       (secp256k1_scalar *)(adaptor_sigr.d + 3),(secp256k1_scalar *)0x0,
                       (secp256k1_scalar *)0x0,adaptor_sig162);
    if (iVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      secp256k1_ecdsa_signature_load
                (ctx,(secp256k1_scalar *)(deckey.d + 3),(secp256k1_scalar *)(r.d + 3),sig);
      uVar2 = secp256k1_scalar_eq((secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)(deckey.d + 3));
      iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)(r.d + 3));
      ctx_local._4_4_ = (uint)((iVar1 != 0 ^ 0xffU) & 1) & uVar2 & 1;
      secp256k1_scalar_inverse
                ((secp256k1_scalar *)&enckey_expected_ge.infinity,(secp256k1_scalar *)(r.d + 3));
      secp256k1_scalar_mul
                ((secp256k1_scalar *)&enckey_expected_ge.infinity,
                 (secp256k1_scalar *)&enckey_expected_ge.infinity,
                 (secp256k1_scalar *)(adaptor_sigr.d + 3));
      secp256k1_ecmult_gen
                (&ctx->ecmult_gen_ctx,(secp256k1_gej *)(enckey33 + 0x20),
                 (secp256k1_scalar *)&enckey_expected_ge.infinity);
      secp256k1_ge_set_gej
                ((secp256k1_ge *)&enckey_expected_gej.infinity,(secp256k1_gej *)(enckey33 + 0x20));
      secp256k1_declassify(ctx,&enckey_expected_gej.infinity,0x58);
      iVar1 = secp256k1_eckey_pubkey_serialize
                        ((secp256k1_ge *)&enckey_expected_gej.infinity,(uchar *)&size,
                         &stack0xfffffffffffffdf0,0x102);
      if (iVar1 == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        iVar1 = secp256k1_ec_pubkey_serialize(ctx,&local_1d8,&stack0xfffffffffffffdf0,enckey,0x102);
        if (iVar1 == 0) {
          ctx_local._4_4_ = 0;
        }
        else {
          iVar1 = secp256k1_memcmp_var((void *)((long)&size + 1),auStack_1d7,0x20);
          if (iVar1 == 0) {
            if ((uchar)size != local_1d8) {
              secp256k1_scalar_negate
                        ((secp256k1_scalar *)&enckey_expected_ge.infinity,
                         (secp256k1_scalar *)&enckey_expected_ge.infinity);
            }
            secp256k1_scalar_get_b32(deckey32,(secp256k1_scalar *)&enckey_expected_ge.infinity);
            secp256k1_scalar_clear((secp256k1_scalar *)&enckey_expected_ge.infinity);
            secp256k1_scalar_clear((secp256k1_scalar *)(adaptor_sigr.d + 3));
            secp256k1_scalar_clear((secp256k1_scalar *)(r.d + 3));
          }
          else {
            ctx_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_adaptor_recover(const secp256k1_context* ctx, unsigned char *deckey32, const secp256k1_ecdsa_signature *sig, const unsigned char *adaptor_sig162, const secp256k1_pubkey *enckey) {
    secp256k1_scalar sp, adaptor_sigr;
    secp256k1_scalar s, r;
    secp256k1_scalar deckey;
    secp256k1_ge enckey_expected_ge;
    secp256k1_gej enckey_expected_gej;
    unsigned char enckey33[33];
    unsigned char enckey_expected33[33];
    size_t size = 33;
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(deckey32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(adaptor_sig162 != NULL);
    ARG_CHECK(enckey != NULL);

    if (!secp256k1_ecdsa_adaptor_sig_deserialize(NULL, &adaptor_sigr, NULL, &sp, NULL, NULL, adaptor_sig162)) {
        return 0;
    }
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    /* Check that we're not looking at some unrelated signature */
    ret &= secp256k1_scalar_eq(&adaptor_sigr, &r);
    /* y = s⁻¹ * s' */
    ret &= !secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_inverse(&deckey, &s);
    secp256k1_scalar_mul(&deckey, &deckey, &sp);

    /* Deal with ECDSA malleability */
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &enckey_expected_gej, &deckey);
    secp256k1_ge_set_gej(&enckey_expected_ge, &enckey_expected_gej);
    /* We declassify non-secret enckey_expected_ge to allow using it as a
     * branch point. */
    secp256k1_declassify(ctx, &enckey_expected_ge, sizeof(enckey_expected_ge));
    if (!secp256k1_eckey_pubkey_serialize(&enckey_expected_ge, enckey_expected33, &size, SECP256K1_EC_COMPRESSED)) {
        /* Unreachable from tests (and other VERIFY builds) and therefore this
         * branch should be ignored in test coverage analysis.
         *
         * Proof:
         *     eckey_pubkey_serialize fails <=> deckey = 0
         *     deckey = 0 <=> s^-1 = 0 or sp = 0
         *     case 1: s^-1 = 0 impossible by the definition of multiplicative
         *             inverse and because the scalar_inverse implementation
         *             VERIFY_CHECKs that the inputs are valid scalars.
         *     case 2: sp = 0 impossible because ecdsa_adaptor_sig_deserialize would have already failed
         */
        return 0;
    }
    if (!secp256k1_ec_pubkey_serialize(ctx, enckey33, &size, enckey, SECP256K1_EC_COMPRESSED)) {
        return 0;
    }
    if (secp256k1_memcmp_var(&enckey_expected33[1], &enckey33[1], 32) != 0) {
        return 0;
    }
    if (enckey_expected33[0] != enckey33[0]) {
        /* try Y_implied == -Y */
        secp256k1_scalar_negate(&deckey, &deckey);
    }
    secp256k1_scalar_get_b32(deckey32, &deckey);

    secp256k1_scalar_clear(&deckey);
    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_clear(&s);

    return ret;
}